

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

void __thiscall
__gnu_cxx::new_allocator<soul::heart::Parser::ScannedTopLevelItem>::
construct<soul::heart::Parser::ScannedTopLevelItem,soul::heart::Parser::ScannedTopLevelItem>
          (new_allocator<soul::heart::Parser::ScannedTopLevelItem> *this,ScannedTopLevelItem *__p,
          ScannedTopLevelItem *__args)

{
  __p->module = __args->module;
  (__p->moduleStartPos).data = (__args->moduleStartPos).data;
  (__p->functionParamCode).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (__args->functionParamCode).
       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__p->functionParamCode).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (__args->functionParamCode).
       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__p->functionParamCode).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (__args->functionParamCode).
       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__args->functionParamCode).
  super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->functionParamCode).
  super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->functionParamCode).
  super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->functionBodyCode).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (__args->functionBodyCode).
       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__p->functionBodyCode).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (__args->functionBodyCode).
       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__p->functionBodyCode).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (__args->functionBodyCode).
       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__args->functionBodyCode).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->functionBodyCode).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->functionBodyCode).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->structBodyCode).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (__args->structBodyCode).
       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__p->structBodyCode).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (__args->structBodyCode).
       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__p->structBodyCode).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (__args->structBodyCode).
       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__args->structBodyCode).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->structBodyCode).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->structBodyCode).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->inputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
  super__Vector_impl_data._M_start =
       (__args->inputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__p->inputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (__args->inputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (__p->inputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (__args->inputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (__args->inputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->inputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->inputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->outputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl
  .super__Vector_impl_data._M_start =
       (__args->outputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__p->outputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (__args->outputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__p->outputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (__args->outputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__args->outputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->outputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->outputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->stateVariableDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (__args->stateVariableDecls).
       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__p->stateVariableDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (__args->stateVariableDecls).
       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__p->stateVariableDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (__args->stateVariableDecls).
       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__args->stateVariableDecls).
  super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->stateVariableDecls).
  super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->stateVariableDecls).
  super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

ScannedTopLevelItem (Module& m) : module (m) {}